

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall
KokkosTools::SpaceTimeStack::Allocations::allocate
          (Allocations *this,string *name,void *ptr,uint64_t size,StackNode *frame)

{
  pair<std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::Allocation>,_bool> pVar1;
  Allocation local_78;
  _Base_ptr local_40;
  pair<std::_Rb_tree_const_iterator<KokkosTools::SpaceTimeStack::Allocation>,_bool> res;
  StackNode *frame_local;
  uint64_t size_local;
  void *ptr_local;
  string *name_local;
  Allocations *this_local;
  
  res._8_8_ = frame;
  if (ptr == (void *)0x0) {
    if (size != 0) {
      __assert_fail("size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0x20d,
                    "void KokkosTools::SpaceTimeStack::Allocations::allocate(std::string &&, const void *, std::uint64_t, StackNode *)"
                   );
    }
  }
  else {
    Allocation::Allocation(&local_78,name,ptr,size,frame);
    pVar1 = std::
            set<KokkosTools::SpaceTimeStack::Allocation,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
            ::emplace<KokkosTools::SpaceTimeStack::Allocation>(&this->alloc_set,&local_78);
    local_40 = (_Base_ptr)pVar1.first._M_node;
    res.first._M_node._0_1_ = pVar1.second;
    Allocation::~Allocation(&local_78);
    if (((byte)res.first._M_node & 1) == 0) {
      __assert_fail("res.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                    ,0x211,
                    "void KokkosTools::SpaceTimeStack::Allocations::allocate(std::string &&, const void *, std::uint64_t, StackNode *)"
                   );
    }
    this->total_size = size + this->total_size;
  }
  return;
}

Assistant:

void allocate(std::string&& name, const void* ptr, std::uint64_t size,
                StackNode* frame) {
    if (ptr == nullptr) {
      assert(size == 0);
      return;
    }
    auto res = alloc_set.emplace(Allocation(std::move(name), ptr, size, frame));
    assert(res.second);
    total_size += size;
  }